

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O0

error<idx2::mmap_err_code> idx2::MapFile(mmap_file *MMap,i64 Bytes)

{
  __syscall_slong_t _Var1;
  int iVar2;
  error<idx2::mmap_err_code> eVar3;
  mmap_file *local_110;
  mmap_err_code local_108;
  undefined2 uStack_104;
  anon_class_1_0_00000001 local_f9;
  mmap_file *local_f8;
  mmap_err_code local_f0;
  undefined2 uStack_ec;
  anon_class_1_0_00000001 local_e1;
  byte *local_e0;
  void *MapAddress;
  mmap_err_code local_d0;
  undefined2 uStack_cc;
  anon_class_1_0_00000001 local_c1;
  undefined1 local_c0 [8];
  stat Stat;
  size_t FileSize;
  i64 Bytes_local;
  mmap_file *MMap_local;
  mmap_err_code local_10;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  _Var1 = Bytes;
  if ((Bytes == 0) &&
     (iVar2 = fstat(MMap->File,(stat *)local_c0), _Var1 = Stat.__glibc_reserved[2], iVar2 == 0)) {
    Stat.__glibc_reserved[2] = Stat.st_rdev;
    _Var1 = Stat.__glibc_reserved[2];
  }
  Stat.__glibc_reserved[2] = _Var1;
  if ((MMap->Mode == Write) &&
     (iVar2 = posix_fallocate(MMap->File,0,Stat.__glibc_reserved[2]), iVar2 == -1)) {
    eVar3 = MapFile::anon_class_1_0_00000001::operator()(&local_c1);
    MapAddress = eVar3.Msg;
    MMap_local = (mmap_file *)MapAddress;
    local_d0 = eVar3.Code;
    local_10 = local_d0;
    uStack_cc = eVar3._12_2_;
    uStack_c = uStack_cc;
  }
  else {
    iVar2 = 3;
    if (MMap->Mode == Read) {
      iVar2 = 1;
    }
    local_e0 = (byte *)mmap((void *)0x0,Stat.__glibc_reserved[2],iVar2,1,MMap->File,0);
    if (local_e0 == (byte *)0xffffffffffffffff) {
      eVar3 = MapFile::anon_class_1_0_00000001::operator()(&local_e1);
      local_f8 = (mmap_file *)eVar3.Msg;
      MMap_local = local_f8;
      local_f0 = eVar3.Code;
      local_10 = local_f0;
      uStack_ec = eVar3._12_2_;
      uStack_c = uStack_ec;
    }
    else {
      (MMap->Buf).Data = local_e0;
      (MMap->Buf).Bytes = Stat.__glibc_reserved[2];
      eVar3 = MapFile::anon_class_1_0_00000001::operator()(&local_f9);
      local_110 = (mmap_file *)eVar3.Msg;
      MMap_local = local_110;
      local_108 = eVar3.Code;
      local_10 = local_108;
      uStack_104 = eVar3._12_2_;
      uStack_c = uStack_104;
    }
  }
  eVar3.Code = local_10;
  eVar3.Msg = (cstr)MMap_local;
  eVar3.StackIdx = (undefined1)uStack_c;
  eVar3.StrGened = (bool)uStack_c._1_1_;
  eVar3._14_2_ = uStack_a;
  return eVar3;
}

Assistant:

error<mmap_err_code>
MapFile(mmap_file* MMap, i64 Bytes)
{
#if defined(_WIN32)
  LARGE_INTEGER FileSize{ { 0, 0 } };
  if (!GetFileSizeEx(MMap->File, &FileSize) || Bytes != 0)
    FileSize.QuadPart = Bytes;
  MMap->FileMapping =
    CreateFileMapping(MMap->File,
                      NULL,
                      MMap->Mode == map_mode::Read ? PAGE_READONLY : PAGE_READWRITE,
                      FileSize.HighPart,
                      FileSize.LowPart,
                      0);
  if (MMap->FileMapping == NULL)
    return idx2_Error(mmap_err_code::MappingFailed);

  LPVOID MapAddress = MapViewOfFile(MMap->FileMapping,
                                    MMap->Mode == map_mode::Read    ? FILE_MAP_READ
                                    : MMap->Mode == map_mode::Write ? FILE_MAP_WRITE
                                                                    : FILE_MAP_ALL_ACCESS,
                                    0,
                                    0,
                                    0);
  if (MapAddress == NULL)
    return idx2_Error(mmap_err_code::MapViewFailed);
  MMap->Buf.Data = (byte*)MapAddress;
  MMap->Buf.Bytes = FileSize.QuadPart;
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  size_t FileSize;
  struct ::stat Stat;
  if (Bytes != 0)
    FileSize = Bytes;
  else if (fstat(MMap->File, &Stat) == 0)
    FileSize = Stat.st_size;
  if (MMap->Mode == map_mode::Write)
#if defined(__APPLE__)
    if (!mac_fallocate(MMap->File, FileSize))
      return idx2_Error(mmap_err_code::AllocateFailed);
#else
    if (posix_fallocate(MMap->File, 0, FileSize) == -1)
      return idx2_Error(mmap_err_code::AllocateFailed);
#endif
  void* MapAddress = mmap(0,
                          FileSize,
                          MMap->Mode == map_mode::Read ? PROT_READ : PROT_READ | PROT_WRITE,
                          MAP_SHARED,
                          MMap->File,
                          0);
  if (MapAddress == MAP_FAILED)
    return idx2_Error(mmap_err_code::MapViewFailed);
  MMap->Buf.Data = (byte*)MapAddress;
  MMap->Buf.Bytes = FileSize;
#endif
  return idx2_Error(mmap_err_code::NoError);
}